

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

Amount __thiscall
cfd::CoinSelectionOption::GetConfidentialDustFeeAmount(CoinSelectionOption *this,Address *address)

{
  undefined1 uVar1;
  undefined8 extraout_RDX;
  Address *in_RSI;
  long in_RDI;
  Amount AVar2;
  uint32_t size;
  ConfidentialTxOutReference txout;
  ConfidentialTxOut ctxout;
  Script locking_script;
  FeeCalculator dust_fee;
  undefined7 in_stack_fffffffffffffd10;
  uint64_t local_2d8;
  undefined8 in_stack_fffffffffffffd38;
  uint32_t size_00;
  undefined1 in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd41;
  ConfidentialTxOutReference local_2b0;
  ConfidentialValue local_1b8;
  ConfidentialAssetId local_180;
  ConfidentialTxOut local_158;
  Script local_60;
  FeeCalculator local_24;
  Address *local_20;
  int64_t local_10;
  undefined1 local_8;
  
  size_00 = (uint32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  if (*(long *)(in_RDI + 0x28) < 1) {
    local_2d8 = 3000;
  }
  else {
    local_2d8 = *(uint64_t *)(in_RDI + 0x28);
  }
  local_20 = in_RSI;
  FeeCalculator::FeeCalculator(&local_24,local_2d8);
  core::Address::GetLockingScript(&local_60,local_20);
  core::ConfidentialAssetId::ConfidentialAssetId(&local_180);
  core::ConfidentialValue::ConfidentialValue(&local_1b8);
  core::ConfidentialTxOut::ConfidentialTxOut(&local_158,&local_60,&local_180,&local_1b8);
  core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x558d5e);
  core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x558d6b);
  core::ConfidentialTxOutReference::ConfidentialTxOutReference(&local_2b0,&local_158);
  core::ConfidentialTxOutReference::GetSerializeVsize(&local_2b0,true,0,0x34,(uint32_t *)0x0,0);
  core::Script::IsWitnessProgram(&local_60);
  AVar2 = FeeCalculator::GetFee
                    ((FeeCalculator *)CONCAT71(in_stack_fffffffffffffd41,in_stack_fffffffffffffd40),
                     size_00);
  local_10 = AVar2.amount_;
  uVar1 = AVar2.ignore_check_;
  local_8 = uVar1;
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)CONCAT17(uVar1,in_stack_fffffffffffffd10));
  core::ConfidentialTxOut::~ConfidentialTxOut(&local_158);
  core::Script::~Script((Script *)CONCAT17(uVar1,in_stack_fffffffffffffd10));
  AVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  AVar2.ignore_check_ = (bool)local_8;
  AVar2.amount_ = local_10;
  return AVar2;
}

Assistant:

Amount CoinSelectionOption::GetConfidentialDustFeeAmount(
    const Address& address) const {
  FeeCalculator dust_fee(
      (dust_fee_rate_ <= 0) ? kDustRelayTxFeeRate : dust_fee_rate_);
  Script locking_script = address.GetLockingScript();
  ConfidentialTxOut ctxout(
      locking_script, ConfidentialAssetId(), ConfidentialValue());
  ConfidentialTxOutReference txout(ctxout);
  uint32_t size = txout.GetSerializeVsize(true);

  // Reference: bitcoin/src/policy/policy.cpp : GetDustThreshold()
  if (locking_script.IsWitnessProgram()) {
    // sum the sizes of the parts of a transaction input
    // with 75% segwit discount applied to the script size.
    size += (32 + 4 + 1 + (107 / kWitnessScaleFactor) + 4);
  } else {
    size += (32 + 4 + 1 + 107 + 4);  // the 148 mentioned above
  }
  return dust_fee.GetFee(size);
}